

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *p,int fSeq)

{
  int iVar1;
  Tim_Man_t *p_00;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar3 = Tim_ManPiNum(p_00);
  iVar4 = Tim_ManPoNum(p_00);
  if (fSeq == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = Gia_ManRegBoxNum(p);
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x61,"void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *, int)");
  }
  iVar6 = Gia_ManBoxNum(p);
  if (iVar6 < 1) {
    __assert_fail("Gia_ManBoxNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x62,"void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *, int)");
  }
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
LAB_0022bf9b:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar6 = p->nTravIds;
  piVar8 = p->pTravIds;
  *piVar8 = iVar6;
  if (iVar3 - iVar5 != 0 && iVar5 <= iVar3) {
    pVVar7 = p->vCis;
    uVar11 = 0;
    do {
      lVar12 = (long)pVVar7->nSize;
      if (lVar12 - p->nRegs <= (long)uVar11) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (lVar12 <= (long)uVar11) goto LAB_0022bf7c;
      iVar1 = pVVar7->pArray[uVar11];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0022bf5d;
      if (p->nTravIdsAlloc <= iVar1) goto LAB_0022bf9b;
      piVar8[iVar1] = iVar6;
      uVar11 = uVar11 + 1;
    } while ((uint)(iVar3 - iVar5) != uVar11);
  }
  iVar6 = Gia_ManRegBoxNum(p);
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar3 = iVar6;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar3;
  if (iVar3 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar7->pArray = piVar8;
  pVVar10 = p->vCos;
  iVar3 = pVVar10->nSize;
  uVar13 = iVar3 - (iVar4 + p->nRegs);
  iVar4 = iVar3 - p->nRegs;
  if ((int)uVar13 < iVar4 - iVar5) {
    uVar11 = (ulong)uVar13;
    do {
      iVar6 = (int)uVar11;
      if (iVar4 <= iVar6) {
LAB_0022bfba:
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar13 < 0) || (iVar3 <= iVar6)) {
LAB_0022bf7c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar8 = pVVar10->pArray;
      iVar3 = piVar8[uVar11];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0022bf5d;
      if (p->nTravIdsAlloc <= iVar3) goto LAB_0022bf9b;
      pGVar2 = p->pObjs;
      p->pTravIds[iVar3] = p->nTravIds;
      if (pVVar10->nSize - p->nRegs <= iVar6) goto LAB_0022bfba;
      if (pVVar10->nSize <= iVar6) goto LAB_0022bf7c;
      iVar3 = piVar8[uVar11];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0022bf5d;
      Gia_ManMarkSeqGiaWithBoxes_rec
                (p,pGVar2 + iVar3 + -(ulong)((uint)*(undefined8 *)(pGVar2 + iVar3) & 0x1fffffff),
                 pVVar7);
      uVar11 = uVar11 + 1;
      pVVar10 = p->vCos;
      iVar3 = pVVar10->nSize;
      iVar4 = iVar3 - p->nRegs;
    } while ((int)uVar11 < iVar4 - iVar5);
  }
  if ((fSeq != 0) && (0 < pVVar7->nSize)) {
    lVar12 = 0;
    do {
      iVar3 = pVVar7->pArray[lVar12];
      lVar9 = (long)iVar3;
      if ((lVar9 < 0) || (p->nObjs <= iVar3)) {
LAB_0022bf5d:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + lVar9;
      if ((-1 < (int)(uint)*(undefined8 *)pGVar2) ||
         (((uint)*(undefined8 *)pGVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                      ,0x74,"void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *, int)");
      }
      if (p->nTravIdsAlloc <= iVar3) goto LAB_0022bf9b;
      p->pTravIds[lVar9] = p->nTravIds;
      Gia_ManMarkSeqGiaWithBoxes_rec
                (p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),pVVar7);
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar7->nSize);
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  return;
}

Assistant:

void Gia_ManMarkSeqGiaWithBoxes( Gia_Man_t * p, int fSeq )
{
    // CI order: real PIs + flop outputs + box outputs
    // CO order: box inputs + real POs + flop inputs
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int nRealCis = Tim_ManPiNum(pManTime);
    int nRealCos = Tim_ManPoNum(pManTime);
    int i, nRegs = fSeq ? Gia_ManRegBoxNum(p) : 0;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManBoxNum(p) > 0 );
    // mark the terminals
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nRealCis - nRegs; i++ )
        Gia_ObjSetTravIdCurrent( p, Gia_ManPi(p, i) );
    // collect flops reachable from the POs
    vRoots = Vec_IntAlloc( Gia_ManRegBoxNum(p) );
    for ( i = Gia_ManPoNum(p) - nRealCos; i < Gia_ManPoNum(p) - nRegs; i++ )
    {
        Gia_ObjSetTravIdCurrent( p, Gia_ManPo(p, i) );
        Gia_ManMarkSeqGiaWithBoxes_rec( p, Gia_ObjFanin0(Gia_ManPo(p, i)), vRoots );
    }
    // collect flops reachable from roots
    if ( fSeq )
    {
        Gia_ManForEachObjVec( vRoots, p, pObj, i )
        {
            assert( Gia_ObjIsCo(pObj) );
            Gia_ObjSetTravIdCurrent( p, pObj );
            Gia_ManMarkSeqGiaWithBoxes_rec( p, Gia_ObjFanin0(pObj), vRoots );
        }
        //printf( "Explored %d flops\n", Vec_IntSize(vRoots) );
    }
    Vec_IntFree( vRoots );
}